

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

size_t __thiscall NULLCString::strlen(NULLCString *this,char *__s)

{
  size_t sVar1;
  char *error;
  
  if (this == (NULLCString *)0x0) {
    error = "string is null";
  }
  else {
    error = "string is not null-terminated";
    if ((int)__s != 0) {
      sVar1 = 0;
      do {
        if (this[sVar1] == (NULLCString)0x0) {
          return sVar1;
        }
        sVar1 = sVar1 + 1;
      } while ((int)__s != (int)sVar1);
    }
  }
  nullcThrowError(error);
  return 0xffffffff;
}

Assistant:

int strlen(NULLCArray string)
	{
		if(!string.ptr)
		{
			nullcThrowError("string is null");
			return -1;
		}

		for(unsigned i = 0; i < string.len; i++)
		{
			if(!string.ptr[i])
				return i;
		}

		nullcThrowError("string is not null-terminated");
		return -1;
	}